

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall
CUI::DoPopupMenu(CUI *this,int X,int Y,int Width,int Height,void *pContext,
                _func_bool_void_ptr_CUIRect *pfnFunc,int Corners)

{
  CUIRect *pCVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  CUI *in_RDI;
  int in_R8D;
  void *in_R9;
  float fVar2;
  _func_bool_void_ptr_CUIRect *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_10;
  int local_c;
  
  dbg_assert_imp(&in_RDI->m_Enabled,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (char *)0x1decad);
  pCVar1 = Screen(in_RDI);
  local_c = in_ESI;
  if (pCVar1->w <= (float)(in_ESI + in_ECX) && (float)(in_ESI + in_ECX) != pCVar1->w) {
    pCVar1 = Screen(in_RDI);
    local_c = (int)(pCVar1->w - (float)in_ECX);
  }
  fVar2 = (float)(in_EDX + in_R8D);
  pCVar1 = Screen(in_RDI);
  local_10 = in_EDX;
  if (pCVar1->h <= fVar2 && fVar2 != pCVar1->h) {
    pCVar1 = Screen(in_RDI);
    local_10 = (int)(pCVar1->h - (float)in_R8D);
  }
  in_RDI->m_aPopupMenus[in_RDI->m_NumPopupMenus].m_Rect.x = (float)local_c;
  in_RDI->m_aPopupMenus[in_RDI->m_NumPopupMenus].m_Rect.y = (float)local_10;
  in_RDI->m_aPopupMenus[in_RDI->m_NumPopupMenus].m_Rect.w = (float)in_ECX;
  in_RDI->m_aPopupMenus[in_RDI->m_NumPopupMenus].m_Rect.h = (float)in_R8D;
  in_RDI->m_aPopupMenus[in_RDI->m_NumPopupMenus].m_Corners = in_stack_00000010;
  in_RDI->m_aPopupMenus[in_RDI->m_NumPopupMenus].m_pContext = in_R9;
  in_RDI->m_aPopupMenus[in_RDI->m_NumPopupMenus].m_pfnFunc = in_stack_00000008;
  in_RDI->m_aPopupMenus[in_RDI->m_NumPopupMenus].m_New = true;
  in_RDI->m_NumPopupMenus = in_RDI->m_NumPopupMenus + 1;
  return;
}

Assistant:

void CUI::DoPopupMenu(int X, int Y, int Width, int Height, void *pContext, bool (*pfnFunc)(void *pContext, CUIRect View), int Corners)
{
	dbg_assert(m_NumPopupMenus < MAX_POPUP_MENUS, "max popup menus exceeded");

	if(X + Width > Screen()->w)
		X = Screen()->w - Width;
	if(Y + Height > Screen()->h)
		Y = Screen()->h - Height;

	m_aPopupMenus[m_NumPopupMenus].m_Rect.x = X;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.y = Y;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.w = Width;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.h = Height;
	m_aPopupMenus[m_NumPopupMenus].m_Corners = Corners;
	m_aPopupMenus[m_NumPopupMenus].m_pContext = pContext;
	m_aPopupMenus[m_NumPopupMenus].m_pfnFunc = pfnFunc;
	m_aPopupMenus[m_NumPopupMenus].m_New = true;
	m_NumPopupMenus++;
}